

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O3

int skeinMacInit(SkeinCtx_t *ctx,uint8_t *key,size_t keyLen,size_t hashBitLen)

{
  ulong uVar1;
  int iVar2;
  anon_union_288_4_58cffef0_for_m *ctx_00;
  
  if (ctx == (SkeinCtx_t *)0x0) {
    return 1;
  }
  if (hashBitLen != 0) {
    ctx_00 = &ctx->m;
    uVar1 = ctx->skeinSize;
    if (uVar1 == 0x400) {
      iVar2 = Skein1024_InitExt(&ctx_00->s1024,hashBitLen,0,key,keyLen);
    }
    else if (uVar1 == 0x200) {
      iVar2 = Skein_512_InitExt(&ctx_00->s512,hashBitLen,0,key,keyLen);
    }
    else {
      if (uVar1 != 0x100) {
        return 1;
      }
      iVar2 = Skein_256_InitExt(&ctx_00->s256,hashBitLen,0,key,keyLen);
    }
    if (iVar2 == 0) {
      memcpy(ctx->XSave,(void *)((long)&ctx->m + 0x20),uVar1 >> 3);
      iVar2 = 0;
    }
    return iVar2;
  }
  return 2;
}

Assistant:

int skeinMacInit(SkeinCtx_t* ctx, const uint8_t *key, size_t keyLen,
                 size_t hashBitLen)
{
    int ret = SKEIN_FAIL;
    u64b_t*  X = NULL;
    size_t Xlen = 0;
    uint64_t treeInfo = SKEIN_CFG_TREE_INFO_SEQUENTIAL;

    Skein_Assert(ctx, SKEIN_FAIL);

    X = ctx->m.s256.X;
    Xlen = ctx->skeinSize/8;

    Skein_Assert(hashBitLen, SKEIN_BAD_HASHLEN);

    switch (ctx->skeinSize) {
    case Skein256:
        ret = Skein_256_InitExt(&ctx->m.s256, hashBitLen,
                                treeInfo,
                                (const u08b_t*)key, keyLen);

        break;
    case Skein512:
        ret = Skein_512_InitExt(&ctx->m.s512, hashBitLen,
                                treeInfo,
                                (const u08b_t*)key, keyLen);
        break;
    case Skein1024:
        ret = Skein1024_InitExt(&ctx->m.s1024, hashBitLen,
                                treeInfo,
                                (const u08b_t*)key, keyLen);

        break;
    }
    if (ret == SKEIN_SUCCESS) {
        /* Save chaining variables for this combination of key, keyLen, hashBitLen */
        memcpy(ctx->XSave, X, Xlen);
    }
    return ret;
}